

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_file.cc
# Opt level: O3

void __thiscall
google::protobuf::compiler::cpp::FileGenerator::ForwardDeclarations::AddEnum
          (ForwardDeclarations *this,EnumDescriptor *d)

{
  mapped_type *ppEVar1;
  EnumDescriptor *in_RDX;
  string local_38;
  
  ClassName_abi_cxx11_(&local_38,(cpp *)d,in_RDX);
  ppEVar1 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::EnumDescriptor_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::EnumDescriptor_*>_>_>
            ::operator[](&this->enums_,&local_38);
  *ppEVar1 = d;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p);
  }
  return;
}

Assistant:

void AddEnum(const EnumDescriptor* d) { enums_[ClassName(d)] = d; }